

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_text_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  int iVar3;
  coda_type_text *pcVar4;
  
  iVar2 = handle_format_attribute_for_type(info,attr);
  iVar3 = -1;
  if (iVar2 == 0) {
    pnVar1 = info->node;
    pnVar1->free_data = coda_type_release;
    pcVar4 = coda_type_text_new(pnVar1->format);
    info->node->data = pcVar4;
    if (pcVar4 != (coda_type_text *)0x0) {
      iVar2 = handle_name_attribute_for_type(info,attr);
      if (iVar2 == 0) {
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xb] = string_data_init;
        pnVar1->add_element_to_parent[0xb] = type_set_description;
        pnVar1 = info->node;
        pnVar1->init_sub_element[8] = integer_constant_or_expression_init;
        pnVar1->add_element_to_parent[8] = type_set_byte_size;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x10] = string_data_init;
        pnVar1->add_element_to_parent[0x10] = cd_text_set_fixed_value;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0x1c] = cd_native_type_init;
        pnVar1->add_element_to_parent[0x1c] = cd_text_set_read_type;
        pnVar1 = info->node;
        pnVar1->init_sub_element[4] = cd_attribute_init;
        pnVar1->add_element_to_parent[4] = type_add_attribute;
        pnVar1 = info->node;
        pnVar1->finalise_element = cd_text_finalise;
        iVar3 = handle_xml_name((parser_info *)pnVar1,attr);
        iVar3 = -(uint)(iVar3 != 0);
      }
    }
  }
  return iVar3;
}

Assistant:

static int cd_text_init(parser_info *info, const char **attr)
{
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_text_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_byte_size, integer_constant_or_expression_init, type_set_byte_size);
    register_sub_element(info->node, element_cd_fixed_value, string_data_init, cd_text_set_fixed_value);
    register_sub_element(info->node, element_cd_native_type, cd_native_type_init, cd_text_set_read_type);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);
    info->node->finalise_element = cd_text_finalise;

    if (handle_xml_name(info, attr) != 0)
    {
        return -1;
    }

    return 0;
}